

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O3

SUNErrCode SUNProfiler_End(SUNProfiler p,char *name)

{
  int iVar1;
  sunTimerStruct *timer;
  sunTimerStruct *local_20;
  
  if (p == (SUNProfiler)0x0) {
    return -9999;
  }
  clock_gettime(1,(timespec *)p->overhead->tic);
  iVar1 = SUNHashMap_GetValue(p->map,name,&local_20);
  if (iVar1 != 0) {
    sunStopTiming(p->overhead);
    if (iVar1 == -1) {
      return -0x26fe;
    }
    if (iVar1 == -2) {
      return -0x26fc;
    }
  }
  sunStopTiming(local_20);
  sunStopTiming(p->overhead);
  return 0;
}

Assistant:

SUNErrCode SUNProfiler_End(SUNProfiler p, const char* name)
{
  SUNErrCode ier;
  sunTimerStruct* timer;

  if (!p) { return SUN_ERR_ARG_CORRUPT; }

  sunStartTiming(p->overhead);

  ier = SUNHashMap_GetValue(p->map, name, (void**)&timer);
  if (ier)
  {
    sunStopTiming(p->overhead);
    if (ier == -1) { return SUN_ERR_PROFILER_MAPGET; }
    if (ier == -2) { return SUN_ERR_PROFILER_MAPKEYNOTFOUND; }
  }

  sunStopTiming(timer);

  sunStopTiming(p->overhead);
  return SUN_SUCCESS;
}